

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O0

UniqueId * __thiscall COLLADASaxFWL::MeshLoader::getUniqueId(MeshLoader *this)

{
  long in_RDI;
  UniqueId *local_8;
  
  if (*(int *)(in_RDI + 0x240) - 1U < 8) {
    local_8 = (UniqueId *)(**(code **)(**(long **)(in_RDI + 0xd0) + 0x18))();
  }
  else if (*(long *)(in_RDI + 0xa0) == 0) {
    local_8 = (UniqueId *)&COLLADAFW::UniqueId::INVALID;
  }
  else {
    local_8 = (UniqueId *)(**(code **)(**(long **)(in_RDI + 0xa0) + 0x18))();
  }
  return local_8;
}

Assistant:

const COLLADAFW::UniqueId& MeshLoader::getUniqueId ()
    {
        switch ( mCurrentPrimitiveType )
        {
        case TRIANGLES:
        case LINES:
        case TRISTRIPS:
        case TRIFANS:
        case POLYGONS:
        case POLYGONS_HOLE:
		case POLYLIST: 
		case LINESTRIPS: 
            return mCurrentMeshPrimitive->getUniqueId (); break;
        default:
            if ( mMesh ) return mMesh->getUniqueId (); break;
        }

        return COLLADAFW::UniqueId::INVALID;
    }